

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void wiz_hack_map(chunk *c,player *p,_func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *func,
                 void *closure)

{
  _Bool _Var1;
  loc grid;
  wchar_t y;
  wchar_t c_00;
  wchar_t x;
  uint8_t color;
  _Bool show;
  uint8_t local_4a;
  _Bool local_49;
  player *local_48;
  _func_void_chunk_ptr_void_ptr_loc__Bool_ptr_uint8_t_ptr *local_40;
  void *local_38;
  
  y = Term->offset_y;
  local_48 = p;
  local_40 = func;
  local_38 = closure;
  while( true ) {
    if ((Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode])) /
        (int)(uint)tile_height + Term->offset_y <= y) break;
    x = Term->offset_x;
    while( true ) {
      if ((~col_map[Term->sidebar_mode] + Term->wid) / (int)(uint)tile_width + Term->offset_x <= x)
      break;
      grid = (loc)loc(x,y);
      _Var1 = square_in_bounds_fully((chunk_conflict *)c,grid);
      if (_Var1) {
        (*local_40)(c,local_38,grid,&local_49,&local_4a);
        if (local_49 == true) {
          _Var1 = loc_eq((loc_conflict)grid,local_48->grid);
          if (_Var1) {
            c_00 = L'@';
          }
          else {
            _Var1 = square_ispassable((chunk_conflict *)c,grid);
            if (_Var1) {
              c_00 = L'*';
            }
            else {
              c_00 = L'#';
            }
          }
          print_rel(c_00,local_4a,y,x);
        }
      }
      x = x + L'\x01';
    }
    y = y + L'\x01';
  }
  return;
}

Assistant:

static void wiz_hack_map(struct chunk *c, struct player *p,
	void (*func)(struct chunk *, void *, struct loc, bool *, uint8_t *),
	void *closure)
{
	int y;

	for (y = Term->offset_y; y < Term->offset_y + SCREEN_HGT; y++) {
		int x;

		for (x = Term->offset_x; x < Term->offset_x + SCREEN_WID; x++) {
			struct loc grid = loc(x, y);
			bool show;
			uint8_t color;

			if (!square_in_bounds_fully(c, grid)) continue;

			(*func)(c, closure, grid, &show, &color);
			if (!show) continue;

			if (loc_eq(grid, p->grid)) {
				print_rel(L'@', color, y, x);
			} else if (square_ispassable(c, grid)) {
				print_rel(L'*', color, y, x);
			} else {
				print_rel(L'#', color, y, x);
			}
		}
	}
}